

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

hash_code llvm::detail::hash_value(DoubleAPFloat *Arg)

{
  APFloat *Arg_00;
  hash_code hVar1;
  ulong uVar2;
  ulong uVar3;
  hash_combine_recursive_helper helper;
  hash_code local_a8;
  hash_code local_a0;
  hash_combine_recursive_helper local_98;
  
  Arg_00 = (Arg->Floats)._M_t.
           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
           super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
  if (Arg_00 == (APFloat *)0x0) {
    hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_98);
    uVar2 = (ulong)Arg->Semantics >> 0x20 ^ local_98.seed;
    uVar3 = (((ulong)Arg->Semantics & 0xffffffff) * 8 + 8 ^ uVar2) * -0x622015f714c7d297;
    uVar2 = (uVar3 >> 0x2f ^ uVar2 ^ uVar3) * -0x622015f714c7d297;
    hVar1.value = (uVar2 >> 0x2f ^ uVar2) * -0x622015f714c7d297;
  }
  else {
    local_a0 = llvm::hash_value(Arg_00);
    local_a8 = llvm::hash_value((Arg->Floats)._M_t.
                                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                                .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1);
    hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_98);
    hVar1 = hashing::detail::hash_combine_recursive_helper::combine<llvm::hash_code,llvm::hash_code>
                      (&local_98,0,local_98.buffer,(char *)&local_98.state,&local_a0,&local_a8);
  }
  return (hash_code)hVar1.value;
}

Assistant:

hash_code hash_value(const DoubleAPFloat &Arg) {
  if (Arg.Floats)
    return hash_combine(hash_value(Arg.Floats[0]), hash_value(Arg.Floats[1]));
  return hash_combine(Arg.Semantics);
}